

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O3

int coda_cdf_variable_add_attribute
              (coda_cdf_variable *type,char *real_name,coda_dynamic_type *attribute_type,
              int update_definition)

{
  int iVar1;
  long lVar2;
  coda_type_record *definition;
  coda_mem_record *pcVar3;
  coda_dynamic_type **ppcVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uVar7;
  coda_type_record **ppcVar8;
  
  if (type == (coda_cdf_variable *)0x0) {
    pcVar6 = "type argument is NULL (%s:%u)";
    uVar7 = 0x1ac;
LAB_00121875:
    coda_set_error(-100,pcVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,uVar7);
    return -1;
  }
  if (real_name == (char *)0x0) {
    pcVar6 = "real_name argument is NULL (%s:%u)";
    uVar7 = 0x1b1;
    goto LAB_00121875;
  }
  if (attribute_type == (coda_dynamic_type *)0x0) {
    pcVar6 = "attribute_type argument is NULL (%s:%u)";
    uVar7 = 0x1b6;
    goto LAB_00121875;
  }
  pcVar3 = type->attributes;
  if (pcVar3 == (coda_mem_record *)0x0) {
    if (update_definition == 0) {
      pcVar6 = "type does not have an attribute with name \'%s\' (%s:%u)";
      iVar1 = -0x66;
      uVar7 = 0x1cf;
      goto LAB_00121949;
    }
    definition = type->definition->attributes;
    if (definition == (coda_type_record *)0x0) {
      definition = coda_type_record_new(type->definition->format);
      type->definition->attributes = definition;
      if (definition == (coda_type_record *)0x0) {
        return -1;
      }
    }
    pcVar3 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
    type->attributes = pcVar3;
    if (pcVar3 == (coda_mem_record *)0x0) {
      return -1;
    }
    ppcVar8 = &pcVar3->definition;
    lVar2 = coda_hashtable_get_index_from_name(pcVar3->definition->real_name_hash_data,real_name);
  }
  else {
    if (pcVar3->backend != coda_backend_memory) {
      pcVar6 = "cannot add attribute (%s:%u)";
      uVar7 = 0x1d7;
      goto LAB_00121875;
    }
    if (type->definition->attributes != pcVar3->definition) {
      __assert_fail("type->definition->attributes == type->attributes->definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                    ,0x1da,
                    "int coda_cdf_variable_add_attribute(coda_cdf_variable *, const char *, coda_dynamic_type *, int)"
                   );
    }
    ppcVar8 = &pcVar3->definition;
    lVar2 = coda_hashtable_get_index_from_name(pcVar3->definition->real_name_hash_data,real_name);
    if (update_definition == 0) {
      if (lVar2 < 0) {
        pcVar6 = "type does not have an attribute with name \'%s\' (%s:%u)";
        iVar1 = -0x66;
        uVar7 = 0x205;
LAB_00121949:
        coda_set_error(iVar1,pcVar6,real_name,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                       ,uVar7);
        return -1;
      }
      if (pcVar3->field_type[lVar2] != (coda_dynamic_type *)0x0) {
        pcVar6 = "attribute \'%s\' is already set (%s:%u)";
        iVar1 = -100;
        uVar7 = 0x20b;
        goto LAB_00121949;
      }
      if ((*ppcVar8)->field[lVar2]->type != attribute_type->definition) {
        pcVar6 = "trying to add attribute \'%s\' of incompatible type (%s:%u)";
        iVar1 = -100;
        uVar7 = 0x211;
        goto LAB_00121949;
      }
      goto LAB_001218b7;
    }
  }
  if ((lVar2 < 0) ||
     ((lVar5 = pcVar3->num_fields, lVar2 < lVar5 &&
      (pcVar3->field_type[lVar2] != (coda_dynamic_type *)0x0)))) {
    iVar1 = coda_type_record_create_field(*ppcVar8,real_name,attribute_type->definition);
    if (iVar1 != 0) {
      return -1;
    }
    lVar2 = (*ppcVar8)->num_fields + -1;
    lVar5 = pcVar3->num_fields;
  }
  if (lVar5 < (*ppcVar8)->num_fields) {
    ppcVar4 = (coda_dynamic_type **)realloc(pcVar3->field_type,(*ppcVar8)->num_fields << 3);
    if (ppcVar4 == (coda_dynamic_type **)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     (*ppcVar8)->num_fields << 3,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                     ,500);
      return -1;
    }
    pcVar3->field_type = ppcVar4;
    for (lVar5 = pcVar3->num_fields; lVar5 < (*ppcVar8)->num_fields; lVar5 = lVar5 + 1) {
      pcVar3->field_type[lVar5] = (coda_dynamic_type *)0x0;
    }
    pcVar3->num_fields = (*ppcVar8)->num_fields;
  }
LAB_001218b7:
  pcVar3->field_type[lVar2] = attribute_type;
  return 0;
}

Assistant:

int coda_cdf_variable_add_attribute(coda_cdf_variable *type, const char *real_name, coda_dynamic_type *attribute_type,
                                    int update_definition)
{
    coda_mem_record *attributes;
    long index = -1;

    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (real_name == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "real_name argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (attribute_type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attribute_type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (type->attributes == NULL)
    {
        if (update_definition)
        {
            if (type->definition->attributes == NULL)
            {
                type->definition->attributes = coda_type_record_new(type->definition->format);
                if (type->definition->attributes == NULL)
                {
                    return -1;
                }
            }
            type->attributes = coda_mem_record_new(type->definition->attributes, NULL);
            if (type->attributes == NULL)
            {
                return -1;
            }
        }
        else
        {
            coda_set_error(CODA_ERROR_INVALID_NAME, "type does not have an attribute with name '%s' (%s:%u)", real_name,
                           __FILE__, __LINE__);
            return -1;
        }
    }
    else
    {
        if (type->attributes->backend != coda_backend_memory)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cannot add attribute (%s:%u)", __FILE__, __LINE__);
            return -1;
        }
        assert(type->definition->attributes == type->attributes->definition);
    }

    attributes = type->attributes;

    index = hashtable_get_index_from_name(attributes->definition->real_name_hash_data, real_name);
    if (update_definition)
    {
        if (index < 0 || (index < attributes->num_fields && attributes->field_type[index] != NULL))
        {
            if (coda_type_record_create_field(attributes->definition, real_name, attribute_type->definition) != 0)
            {
                return -1;
            }
            index = attributes->definition->num_fields - 1;
        }
        if (attributes->num_fields < attributes->definition->num_fields)
        {
            coda_dynamic_type **new_field_type;
            long i;

            new_field_type = realloc(attributes->field_type,
                                     attributes->definition->num_fields * sizeof(coda_dynamic_type *));
            if (new_field_type == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               attributes->definition->num_fields * sizeof(coda_dynamic_type *), __FILE__, __LINE__);

                return -1;
            }
            attributes->field_type = new_field_type;
            for (i = attributes->num_fields; i < attributes->definition->num_fields; i++)
            {
                attributes->field_type[i] = NULL;
            }
            attributes->num_fields = attributes->definition->num_fields;
        }
    }
    else
    {
        if (index < 0)
        {
            coda_set_error(CODA_ERROR_INVALID_NAME, "type does not have an attribute with name '%s' (%s:%u)", real_name,
                           __FILE__, __LINE__);
            return -1;
        }
        if (attributes->field_type[index] != NULL)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attribute '%s' is already set (%s:%u)", real_name, __FILE__,
                           __LINE__);
            return -1;
        }
        if (attributes->definition->field[index]->type != attribute_type->definition)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "trying to add attribute '%s' of incompatible type (%s:%u)",
                           real_name, __FILE__, __LINE__);
            return -1;
        }
    }
    attributes->field_type[index] = attribute_type;

    return 0;
}